

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfacet.cpp
# Opt level: O1

double __thiscall
phyr::MicrofacetDistribution::pdf(MicrofacetDistribution *this,Vector3f *wo,Vector3f *wh)

{
  bool bVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  
  bVar1 = this->sampleVisibleArea;
  (*this->_vptr_MicrofacetDistribution[2])(this,wh);
  if (bVar1 == true) {
    (*this->_vptr_MicrofacetDistribution[3])(this,wo);
    dVar2 = (ABS(wh->z * wo->z + wo->x * wh->x + wo->y * wh->y) *
            extraout_XMM0_Qa * (1.0 / (extraout_XMM0_Qa_00 + 1.0))) / ABS(wo->z);
  }
  else {
    dVar2 = extraout_XMM0_Qa * ABS(wh->z);
  }
  return dVar2;
}

Assistant:

Real MicrofacetDistribution::pdf(const Vector3f& wo, const Vector3f& wh) const {
    if (sampleVisibleArea)
        return d(wh) * g1(wo) * absDot(wo, wh) / absCosTheta(wo);
    else
        return d(wh) * absCosTheta(wh);
}